

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O1

adios2_varinfo *
adios2_inquire_blockinfo(adios2_engine *engine,adios2_variable *variable,size_t step)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  void *pvVar7;
  adios2_varinfo *paVar8;
  adios2_blockinfo *paVar9;
  size_t *psVar10;
  undefined8 *puVar11;
  void *pvVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  size_t sVar16;
  vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
  blocksInfo;
  long local_90;
  long local_88;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"for adios2_engine, in call to adios2_inquire_blockinfo","");
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"for adios2_variable, in call to adios2_get","");
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  uVar1 = *(undefined4 *)(variable + 0x28);
  pvVar7 = (void *)(**(code **)(*(long *)engine + 0x58))(engine,variable,step);
  if (pvVar7 == (void *)0x0) {
    switch(uVar1) {
    case 1:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<signed_char>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<signed_char>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 4;
      sVar14 = lVar13 * -0x70a3d70a3d70a3d7;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x3333333333333330);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x188);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x189);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x27);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x32;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                 *)&local_90);
      break;
    case 2:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<short>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<short>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 4;
      sVar14 = lVar13 * -0x70a3d70a3d70a3d7;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x3333333333333330);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x188);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x189);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x27);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x32;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                 *)&local_90);
      break;
    case 3:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<int>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<int>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 3;
      sVar14 = lVar13 * -0x505050505050505;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * 0x6e6e6e6e6e6e6e70);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 400);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x191);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x28);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x33;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                 *)&local_90);
      break;
    case 4:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<long>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<long>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 5;
      sVar14 = lVar13 * 0x4ec4ec4ec4ec4ec5;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x6276276276276270);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x198);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x199);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x29);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x34;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                 *)&local_90);
      break;
    case 5:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_char>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_char>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 4;
      sVar14 = lVar13 * -0x70a3d70a3d70a3d7;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x3333333333333330);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x188);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x189);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x27);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x32;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                 *)&local_90);
      break;
    case 6:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_short>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_short>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 4;
      sVar14 = lVar13 * -0x70a3d70a3d70a3d7;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x3333333333333330);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x188);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x189);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x27);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x32;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                 *)&local_90);
      break;
    case 7:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_int>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_int>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 3;
      sVar14 = lVar13 * -0x505050505050505;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * 0x6e6e6e6e6e6e6e70);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 400);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x191);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x28);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x33;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                 *)&local_90);
      break;
    case 8:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_long>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_long>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 5;
      sVar14 = lVar13 * 0x4ec4ec4ec4ec4ec5;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x6276276276276270);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x198);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x199);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x29);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x34;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                 *)&local_90);
      break;
    case 9:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<float>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<float>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 3;
      sVar14 = lVar13 * -0x505050505050505;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * 0x6e6e6e6e6e6e6e70);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 400);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x191);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x28);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x33;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                 *)&local_90);
      break;
    case 10:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<double>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<double>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 5;
      sVar14 = lVar13 * 0x4ec4ec4ec4ec4ec5;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x6276276276276270);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x198);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x199);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x29);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x34;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                 *)&local_90);
      break;
    case 0xb:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<long_double>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<long_double>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 6;
      sVar14 = lVar13 * 0x6db6db6db6db6db7;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * 0x4924924924924930);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x1b8);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x1b9);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x2d);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x38;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                 *)&local_90);
      break;
    case 0xc:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<std::complex<float>>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<std::complex<float>>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 5;
      sVar14 = lVar13 * 0x4ec4ec4ec4ec4ec5;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x6276276276276270);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x198);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x199);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x29);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x34;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                 *)&local_90);
      break;
    case 0xd:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<std::complex<double>>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<std::complex<double>>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 3;
      sVar14 = lVar13 * 0x6fb586fb586fb587;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x1745d1745d1745d0);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x1b0);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x1b1);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x2c);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x37;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                 *)&local_90);
      break;
    case 0xe:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<std::__cxx11::string>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 3;
      sVar14 = lVar13 * 0x4fbcda3ac10c9715;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x14fbcda3ac10c970);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x1e0);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x1e1);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x32);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = puVar11[0x1c];
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x3d;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                 *)&local_90);
      break;
    case 0xf:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<char>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<char>((Variable *)&local_90,(ulong)engine);
      paVar8 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_88 - local_90 >> 4;
      sVar14 = lVar13 * -0x70a3d70a3d70a3d7;
      paVar8->nblocks = sVar14;
      paVar9 = (adios2_blockinfo *)malloc(lVar13 * -0x3333333333333330);
      paVar8->BlocksInfo = paVar9;
      pvVar7 = *(void **)(local_90 + 0x30);
      lVar13 = *(long *)(local_90 + 0x38);
      paVar8->Dims = (int)((ulong)(lVar13 - (long)pvVar7) >> 3);
      sVar16 = lVar13 - (long)pvVar7;
      if (sVar16 == 0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        psVar10 = (size_t *)malloc(sVar16);
        memcpy(psVar10,pvVar7,sVar16);
      }
      paVar8->Shape = psVar10;
      paVar8->IsValue = (uint)*(byte *)(local_90 + 0x188);
      paVar8->IsReverseDims = (uint)*(byte *)(local_90 + 0x189);
      if (local_88 != local_90) {
        lVar13 = sVar14 + (sVar14 == 0);
        puVar11 = (undefined8 *)(local_90 + 0x48);
        do {
          paVar9->WriterID = *(int *)(puVar11 + 0x27);
          paVar9->BlockID = puVar11[0x12];
          pvVar7 = (void *)*puVar11;
          sVar16 = puVar11[1] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Start = psVar10;
          pvVar7 = (void *)puVar11[3];
          sVar16 = puVar11[4] - (long)pvVar7;
          if (sVar16 == 0) {
            psVar10 = (size_t *)0x0;
          }
          else {
            psVar10 = (size_t *)malloc(sVar16);
            memcpy(psVar10,pvVar7,sVar16);
          }
          paVar9->Count = psVar10;
          (paVar9->MinUnion).int64 = 0;
          (paVar9->MaxUnion).int64 = 0;
          (paVar9->Value).int64 = 0;
          paVar9 = paVar9 + 1;
          puVar11 = puVar11 + 0x32;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                 *)&local_90);
      break;
    default:
      paVar8 = (adios2_varinfo *)0x0;
    }
  }
  else {
    paVar8 = (adios2_varinfo *)malloc(0x28);
    lVar13 = *(long *)((long)pvVar7 + 0x20);
    lVar15 = *(long *)((long)pvVar7 + 0x28);
    sVar16 = lVar15 - lVar13;
    sVar14 = ((long)sVar16 >> 4) * -0x3333333333333333;
    paVar8->nblocks = sVar14;
    paVar8->Shape = (size_t *)0x0;
    paVar9 = (adios2_blockinfo *)malloc(sVar16);
    paVar8->BlocksInfo = paVar9;
    iVar2 = *(int *)((long)pvVar7 + 0xc);
    paVar8->Dims = iVar2;
    if (*(char *)((long)pvVar7 + 8) == '\x01') {
      psVar10 = (size_t *)malloc(8);
      paVar8->Shape = psVar10;
      *psVar10 = *(size_t *)((long)pvVar7 + 0x10);
    }
    else {
      pvVar4 = *(void **)((long)pvVar7 + 0x10);
      if (pvVar4 != (void *)0x0) {
        sVar16 = (long)iVar2 << 3;
        psVar10 = (size_t *)malloc(sVar16);
        paVar8->Shape = psVar10;
        memcpy(psVar10,pvVar4,sVar16);
      }
    }
    paVar8->IsValue = (uint)*(byte *)((long)pvVar7 + 0x18);
    paVar8->IsReverseDims = (uint)*(byte *)((long)pvVar7 + 0x19);
    if (lVar15 != lVar13) {
      lVar15 = sVar14 + (sVar14 == 0);
      lVar13 = 0;
      do {
        lVar3 = *(long *)((long)pvVar7 + 0x20);
        *(undefined4 *)((long)&paVar9->WriterID + lVar13) = *(undefined4 *)(lVar3 + lVar13);
        *(undefined8 *)((long)&paVar9->BlockID + lVar13) = *(undefined8 *)(lVar3 + 8 + lVar13);
        if (*(char *)((long)pvVar7 + 8) == '\x01') {
          puVar11 = (undefined8 *)malloc(8);
          *(undefined8 **)((long)&paVar9->Start + lVar13) = puVar11;
          *puVar11 = *(undefined8 *)(lVar3 + 0x10 + lVar13);
          puVar11 = (undefined8 *)malloc(8);
          *(undefined8 **)((long)&paVar9->Count + lVar13) = puVar11;
          *puVar11 = *(undefined8 *)(lVar3 + 0x18 + lVar13);
        }
        else {
          puVar11 = (undefined8 *)((long)&paVar9->Start + lVar13);
          *puVar11 = 0;
          *(undefined8 *)((long)&paVar9->Count + lVar13) = 0;
          pvVar4 = *(void **)(lVar3 + 0x10 + lVar13);
          if (pvVar4 != (void *)0x0) {
            sVar16 = (long)*(int *)((long)pvVar7 + 0xc) << 3;
            pvVar12 = malloc(sVar16);
            *puVar11 = pvVar12;
            memcpy(pvVar12,pvVar4,sVar16);
          }
          pvVar4 = *(void **)(*(long *)((long)pvVar7 + 0x20) + 0x18 + lVar13);
          if (pvVar4 != (void *)0x0) {
            sVar16 = (long)*(int *)((long)pvVar7 + 0xc) << 3;
            pvVar12 = malloc(sVar16);
            *(void **)((long)&paVar9->Count + lVar13) = pvVar12;
            memcpy(pvVar12,pvVar4,sVar16);
          }
        }
        if (*(char *)((long)pvVar7 + 0x18) == '\x01') {
          puVar5 = *(undefined8 **)(*(long *)((long)pvVar7 + 0x20) + 0x40 + lVar13);
          uVar6 = puVar5[1];
          puVar11 = (undefined8 *)((long)&paVar9->Value + lVar13);
          *puVar11 = *puVar5;
          puVar11[1] = uVar6;
        }
        else {
          puVar11 = (undefined8 *)(*(long *)((long)pvVar7 + 0x20) + 0x20 + lVar13);
          uVar6 = puVar11[1];
          puVar5 = (undefined8 *)((long)&paVar9->MinUnion + lVar13);
          *puVar5 = *puVar11;
          puVar5[1] = uVar6;
          puVar11 = (undefined8 *)(*(long *)((long)pvVar7 + 0x20) + 0x30 + lVar13);
          uVar6 = puVar11[1];
          puVar5 = (undefined8 *)((long)&paVar9->MaxUnion + lVar13);
          *puVar5 = *puVar11;
          puVar5[1] = uVar6;
        }
        lVar13 = lVar13 + 0x50;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    if (*(void **)((long)pvVar7 + 0x20) != (void *)0x0) {
      operator_delete(*(void **)((long)pvVar7 + 0x20));
    }
    operator_delete(pvVar7);
  }
  return paVar8;
}

Assistant:

adios2_varinfo *adios2_inquire_blockinfo(adios2_engine *engine, adios2_variable *variable,
                                         const size_t step)
{
    auto lf_CopyDims = [](const std::vector<size_t> &dims) -> size_t * {
        size_t *a = nullptr;
        size_t ndims = dims.size();
        if (ndims > 0)
        {
            a = (size_t *)malloc(dims.size() * sizeof(size_t));
            std::memcpy(a, dims.data(), dims.size() * sizeof(size_t));
        }
        return a;
    };

    adios2_varinfo *varinfo = NULL;

    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for adios2_engine, in call to adios2_inquire_blockinfo");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call "
                                                  "to adios2_get");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::DataType type(variableBase->m_Type);

        const auto minBlocksInfo = engineCpp->MinBlocksInfo(*variableBase, step);

        if (minBlocksInfo)
        {
            varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));
            varinfo->nblocks = minBlocksInfo->BlocksInfo.size();
            varinfo->Shape = NULL;
            varinfo->BlocksInfo =
                (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));
            auto *b = varinfo->BlocksInfo;

            varinfo->Dims = minBlocksInfo->Dims;
            if (minBlocksInfo->WasLocalValue)
            {
                varinfo->Shape = (size_t *)malloc(sizeof(size_t));
                varinfo->Shape[0] = (intptr_t)minBlocksInfo->Shape;
            }
            else
            {
                if (minBlocksInfo->Shape)
                {
                    varinfo->Shape = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                    memcpy(varinfo->Shape, minBlocksInfo->Shape,
                           sizeof(size_t) * minBlocksInfo->Dims);
                }
            }
            varinfo->IsValue = (int)minBlocksInfo->IsValue;
            varinfo->IsReverseDims = (int)minBlocksInfo->IsReverseDims;
            for (size_t i = 0; i < varinfo->nblocks; ++i)
            {
                b[i].WriterID = minBlocksInfo->BlocksInfo[i].WriterID;
                b[i].BlockID = minBlocksInfo->BlocksInfo[i].BlockID;
                if (minBlocksInfo->WasLocalValue)
                {
                    b[i].Start = (size_t *)malloc(sizeof(size_t));
                    b[i].Start[0] = (intptr_t)minBlocksInfo->BlocksInfo[i].Start;
                    b[i].Count = (size_t *)malloc(sizeof(size_t));
                    b[i].Count[0] = (intptr_t)minBlocksInfo->BlocksInfo[i].Count;
                }
                else
                {
                    b[i].Start = b[i].Count = NULL;
                    if (minBlocksInfo->BlocksInfo[i].Start)
                    {
                        b[i].Start = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                        memcpy(b[i].Start, minBlocksInfo->BlocksInfo[i].Start,
                               sizeof(size_t) * minBlocksInfo->Dims);
                    }
                    if (minBlocksInfo->BlocksInfo[i].Count)
                    {
                        b[i].Count = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                        memcpy(b[i].Count, minBlocksInfo->BlocksInfo[i].Count,
                               sizeof(size_t) * minBlocksInfo->Dims);
                    }
                }
                if (minBlocksInfo->IsValue)
                {
                    memcpy(&b[i].Value, minBlocksInfo->BlocksInfo[i].BufferP, sizeof(b[i].Value));
                }
                else
                {
                    memcpy(&b[i].MinUnion, &minBlocksInfo->BlocksInfo[i].MinMax.MinUnion,
                           sizeof(b[i].MinUnion));
                    memcpy(&b[i].MaxUnion, &minBlocksInfo->BlocksInfo[i].MinMax.MaxUnion,
                           sizeof(b[i].MaxUnion));
                }
            }
            delete minBlocksInfo;
            return varinfo;
        }

        /* Call the big gun Engine::BlocksInfo<T> */
        if (type == adios2::DataType::Struct)
        {
            return varinfo;
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            const auto blocksInfo = engineCpp->BlocksInfo<std::string>(
                *dynamic_cast<adios2::core::Variable<std::string> *>(variableBase), step);
            varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));
            varinfo->nblocks = blocksInfo.size();
            varinfo->BlocksInfo =
                (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));
            auto *b = varinfo->BlocksInfo;

            varinfo->Dims = static_cast<int>(blocksInfo[0].Shape.size());
            varinfo->Shape = lf_CopyDims(blocksInfo[0].Shape);
            varinfo->IsValue = (int)blocksInfo[0].IsValue;
            varinfo->IsReverseDims = (int)blocksInfo[0].IsReverseDims;
            for (size_t i = 0; i < varinfo->nblocks; ++i)
            {
                b[i].WriterID = blocksInfo[i].WriterID;
                b[i].BlockID = blocksInfo[i].BlockID;
                b[i].Start = lf_CopyDims(blocksInfo[i].Start);
                b[i].Count = lf_CopyDims(blocksInfo[i].Count);
                // minBlocksInfo->BlocksInfo[i].MinUnion;
                b[i].MinUnion.uint64 = 0;
                // minBlocksInfo->BlocksInfo[i].MaxUnion;
                b[i].MaxUnion.uint64 = 0;
                b[i].Value.str = (char *)blocksInfo[i].Value.data();
            };
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        const auto blocksInfo = engineCpp->BlocksInfo<T>(                                          \
            *dynamic_cast<adios2::core::Variable<T> *>(variableBase), step);                       \
        varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));                                \
        varinfo->nblocks = blocksInfo.size();                                                      \
        varinfo->BlocksInfo =                                                                      \
            (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));               \
        auto *b = varinfo->BlocksInfo;                                                             \
                                                                                                   \
        varinfo->Dims = static_cast<int>(blocksInfo[0].Shape.size());                              \
        varinfo->Shape = lf_CopyDims(blocksInfo[0].Shape);                                         \
        varinfo->IsValue = (int)blocksInfo[0].IsValue;                                             \
        varinfo->IsReverseDims = (int)blocksInfo[0].IsReverseDims;                                 \
        for (size_t i = 0; i < varinfo->nblocks; ++i)                                              \
        {                                                                                          \
            b[i].WriterID = blocksInfo[i].WriterID;                                                \
            b[i].BlockID = blocksInfo[i].BlockID;                                                  \
            b[i].Start = lf_CopyDims(blocksInfo[i].Start);                                         \
            b[i].Count = lf_CopyDims(blocksInfo[i].Count);                                         \
            b[i].MinUnion.uint64 = 0;                                                              \
            b[i].MaxUnion.uint64 = 0;                                                              \
            b[i].Value.uint64 = 0;                                                                 \
        };                                                                                         \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_inquire_blockinfo");
        return NULL;
    }
    return varinfo;
}